

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

ostream * spvtools::utils::operator<<(ostream *os,FloatProxy<float> *value)

{
  float fVar1;
  undefined8 uVar2;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  local_14;
  
  fVar1 = (float)value->data_;
  if (((fVar1 == 0.0) && (!NAN(fVar1))) ||
     ((!NAN(fVar1) && ((int)ABS(fVar1) - 0x800000U < 0x7f000000)))) {
    uVar2 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 9;
    std::ostream::_M_insert<double>((double)fVar1);
    *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar2;
  }
  else {
    operator<<(os,&local_14);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FloatProxy<T>& value) {
  auto float_val = value.getAsFloat();
  switch (std::fpclassify(float_val)) {
    case FP_ZERO:
    case FP_NORMAL: {
      auto saved_precision = os.precision();
      os.precision(std::numeric_limits<T>::max_digits10);
      os << float_val;
      os.precision(saved_precision);
    } break;
    default:
      os << HexFloat<FloatProxy<T>>(value);
      break;
  }
  return os;
}